

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_dart_validator(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  pointer pcVar1;
  t_field *field;
  t_type *ttype;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  pointer pptVar7;
  string field_name;
  char *local_198;
  char local_188;
  undefined7 uStack_187;
  undefined8 uStack_180;
  t_struct *local_178;
  char *local_170;
  long local_168;
  char local_160;
  undefined7 uStack_15f;
  undefined8 uStack_158;
  char *local_150;
  long local_148;
  char local_140;
  undefined7 uStack_13f;
  undefined8 uStack_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_178 = tstruct;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"validate()",10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  scope_up(this,out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"// check for required fields",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar7 = (local_178->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (local_178->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((*pptVar7)->req_ == T_REQUIRED) {
        pcVar1 = ((*pptVar7)->name_)._M_dataplus._M_p;
        local_150 = &local_140;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,pcVar1,pcVar1 + ((*pptVar7)->name_)._M_string_length);
        pcVar2 = local_150;
        iVar5 = tolower((int)*local_150);
        *pcVar2 = (char)iVar5;
        lVar3 = local_148;
        if (local_150 == &local_140) {
          uStack_180 = uStack_138;
          local_198 = &local_188;
        }
        else {
          local_198 = local_150;
        }
        _local_188 = CONCAT71(uStack_13f,local_140);
        local_148 = 0;
        local_140 = '\0';
        local_150 = &local_140;
        bVar4 = type_can_be_null(this,(*pptVar7)->type_);
        if (bVar4) {
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if (",4);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_198,lVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," == null)",9);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," ","");
          scope_up(this,out,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field \'",0x46
                    );
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_198,lVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\' was not present! Struct: \" + toString());",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
          scope_down(this,out,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
        }
        else {
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"// alas, we cannot check \'",0x1a);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_198,lVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\' because it\'s a primitive and you chose the non-beans generator.",
                     0x41);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198);
        }
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (local_178->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"// check that fields of type enum have valid values",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar7 = (local_178->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (local_178->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      field = *pptVar7;
      ttype = field->type_;
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar5 != '\0') {
        pcVar1 = (field->name_)._M_dataplus._M_p;
        local_170 = &local_160;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar1,pcVar1 + (field->name_)._M_string_length);
        pcVar2 = local_170;
        iVar5 = tolower((int)*local_170);
        *pcVar2 = (char)iVar5;
        lVar3 = local_168;
        local_198 = &local_188;
        if (local_170 == &local_160) {
          uStack_180 = uStack_158;
        }
        else {
          local_198 = local_170;
        }
        _local_188 = CONCAT71(uStack_15f,local_160);
        local_168 = 0;
        local_160 = '\0';
        local_170 = &local_160;
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if (",4);
        generate_isset_check_abi_cxx11_(&local_b0,this,field);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," && !",5);
        get_ttype_class_name_abi_cxx11_(&local_d0,this,ttype);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,".VALID_VALUES.contains(",0x17);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_198,lVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"))",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0," ","");
        scope_up(this,out,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"The field \'",0x41
                  );
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_198,lVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\' has been assigned the invalid value ",0x26);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"$",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_198,lVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\");",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
        scope_down(this,out,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198);
        }
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (local_178->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "validate()";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      string field_name = get_member_name((*f_iter)->get_name());
      if (type_can_be_null((*f_iter)->get_type())) {
        indent(out) << "if (" << field_name << " == null)";
        scope_up(out);
        indent(out) << "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field '"
                    << field_name << "' was not present! Struct: \" + toString());"
                    << endl;
        scope_down(out);
      } else {
        indent(out) << "// alas, we cannot check '" << field_name
                    << "' because it's a primitive and you chose the non-beans generator." << endl;
      }
    }
  }

  // check that fields of type enum have valid values
  indent(out) << "// check that fields of type enum have valid values" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    t_type* type = field->get_type();
    // if field is an enum, check that its value is valid
    if (type->is_enum()) {
      string field_name = get_member_name(field->get_name());
      indent(out) << "if (" << generate_isset_check(field) << " && !" << get_ttype_class_name(type)
                  << ".VALID_VALUES.contains(" << field_name << "))";
      scope_up(out);
      indent(out) << "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"The field '"
                  << field_name << "' has been assigned the invalid value "
                  << "$" << field_name << "\");" << endl;
      scope_down(out);
    }
  }

  scope_down(out, endl2);
}